

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::TriangleMesh::getPrimBounds(TriangleMesh *this,size_t primID,affine3f *xfm)

{
  vec3f *p;
  reference pvVar1;
  affine3f *in_RCX;
  size_type in_RDX;
  long in_RSI;
  box3f *in_RDI;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *this_00;
  vec3f vVar2;
  box3f *primBounds;
  affine3f *in_stack_ffffffffffffff70;
  vec3f *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  math::box3f::empty_box();
  p = (vec3f *)(in_RSI + 0x70);
  this_00 = (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)(in_RSI + 0xb8);
  pvVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                     (this_00,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)p,(long)pvVar1->x);
  math::xfmPoint(in_stack_ffffffffffffff70,p);
  math::box3f::extend((box3f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
  pvVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                     (this_00,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)p,(long)pvVar1->y);
  math::xfmPoint(in_stack_ffffffffffffff70,p);
  math::box3f::extend((box3f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
  pvVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator[]
                     (this_00,in_RDX);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)p,(long)pvVar1->z);
  vVar2 = math::xfmPoint(in_RCX,p);
  math::box3f::extend((box3f *)CONCAT44(in_stack_ffffffffffffff94,vVar2.z),vVar2._0_8_);
  return in_RDI;
}

Assistant:

box3f TriangleMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    return primBounds;
  }